

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p224(mbedtls_mpi *N)

{
  ulong uVar1;
  ulong *puVar2;
  mbedtls_mpi_uint *pmVar3;
  int iVar4;
  char c;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  char cVar19;
  uint local_80;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [4];
  
  C.s = 1;
  C.n = 4;
  C.p = Cp;
  Cp[0] = 0;
  Cp[1] = 0;
  Cp[2] = 0;
  Cp[3] = 0;
  iVar4 = mbedtls_mpi_grow(N,7);
  if (iVar4 == 0) {
    pmVar3 = N->p;
    uVar7 = (uint)*pmVar3;
    uVar5 = (uint)(pmVar3[3] >> 0x20);
    uVar11 = uVar7 - uVar5;
    uVar6 = (uint)(pmVar3[5] >> 0x20);
    uVar16 = -(uint)(uVar11 < uVar6) - (uint)(uVar7 < uVar5);
    uVar8 = (uint)(*pmVar3 >> 0x20);
    if ((uVar7 < uVar5) || (uVar11 < uVar6)) {
      cVar19 = -(uVar8 < -uVar16);
    }
    else {
      cVar19 = CARRY4(uVar16,uVar8);
    }
    uVar10 = (uint)pmVar3[4];
    uVar17 = (uVar16 + uVar8) - uVar10;
    uVar7 = (uint)pmVar3[6];
    cVar19 = (cVar19 - (uVar16 + uVar8 < uVar10)) - (uVar17 < uVar7);
    *pmVar3 = CONCAT44(uVar17 - uVar7,uVar11 - uVar6);
    uVar11 = (uint)cVar19;
    uVar8 = (uint)pmVar3[1];
    if (cVar19 < '\0') {
      cVar19 = -(uVar8 < -uVar11);
    }
    else {
      cVar19 = CARRY4(uVar11,uVar8);
    }
    uVar17 = (uint)(pmVar3[4] >> 0x20);
    uVar18 = (uVar11 + uVar8) - uVar17;
    uVar16 = (uint)(pmVar3[6] >> 0x20);
    cVar19 = (cVar19 - (uVar11 + uVar8 < uVar17)) - (uVar18 < uVar16);
    uVar11 = (uint)cVar19;
    uVar8 = (uint)(pmVar3[1] >> 0x20);
    if (cVar19 < '\0') {
      cVar19 = -(uVar8 < -uVar11);
    }
    else {
      cVar19 = CARRY4(uVar11,uVar8);
    }
    uVar12 = (uint)pmVar3[5];
    uVar13 = (uVar11 + uVar8) - uVar12;
    uVar14 = uVar13 + uVar5;
    cVar19 = CARRY4(uVar13,uVar5) + (cVar19 - (uVar11 + uVar8 < uVar12)) + CARRY4(uVar14,uVar6);
    pmVar3[1] = CONCAT44(uVar14 + uVar6,uVar18 - uVar16);
    uVar8 = (uint)cVar19;
    uVar5 = (uint)pmVar3[2];
    if (cVar19 < '\0') {
      cVar19 = -(uVar5 < -uVar8);
    }
    else {
      cVar19 = CARRY4(uVar8,uVar5);
    }
    uVar11 = (uVar8 + uVar5) - uVar6;
    uVar18 = uVar11 + uVar10;
    cVar19 = CARRY4(uVar11,uVar10) + (cVar19 - (uVar8 + uVar5 < uVar6)) + CARRY4(uVar18,uVar7);
    uVar8 = (uint)cVar19;
    uVar6 = (uint)(pmVar3[2] >> 0x20);
    if (cVar19 < '\0') {
      cVar19 = -(uVar6 < -uVar8);
    }
    else {
      cVar19 = CARRY4(uVar8,uVar6);
    }
    uVar5 = (uVar8 + uVar6) - uVar7;
    uVar11 = uVar5 + uVar17;
    cVar19 = CARRY4(uVar5,uVar17) + (cVar19 - (uVar8 + uVar6 < uVar7)) + CARRY4(uVar11,uVar16);
    pmVar3[2] = CONCAT44(uVar11 + uVar16,uVar18 + uVar7);
    uVar8 = (uint)cVar19;
    local_80 = (uint)pmVar3[3];
    if (cVar19 < '\0') {
      cVar19 = -(local_80 < -uVar8);
    }
    else {
      cVar19 = CARRY4(uVar8,local_80);
    }
    uVar6 = (uVar8 + local_80) - uVar16;
    c = (cVar19 - (uVar8 + local_80 < uVar16)) + CARRY4(uVar6,uVar12);
    cVar19 = '\0';
    if ('\0' < c) {
      cVar19 = c;
    }
    pmVar3[3] = (ulong)CONCAT14(cVar19,uVar6 + uVar12);
    uVar15 = 7;
    while (uVar1 = uVar15 + 1, uVar1 < N->n * 2) {
      uVar9 = 0xffffffff00000000;
      if ((uVar15 & 1) == 0) {
        uVar9 = 0xffffffff;
      }
      puVar2 = (ulong *)((long)pmVar3 + (uVar1 & 0xfffffffffffffffe) * 4);
      *puVar2 = *puVar2 & uVar9;
      uVar15 = uVar1;
    }
    if (c < '\0') {
      fix_negative(N,c,&C,0xe0);
    }
  }
  return iVar4;
}

Assistant:

static int ecp_mod_p224( mbedtls_mpi *N )
{
    INIT( 224 );

    SUB(  7 ); SUB( 11 );               NEXT; // A0 += -A7 - A11
    SUB(  8 ); SUB( 12 );               NEXT; // A1 += -A8 - A12
    SUB(  9 ); SUB( 13 );               NEXT; // A2 += -A9 - A13
    SUB( 10 ); ADD(  7 ); ADD( 11 );    NEXT; // A3 += -A10 + A7 + A11
    SUB( 11 ); ADD(  8 ); ADD( 12 );    NEXT; // A4 += -A11 + A8 + A12
    SUB( 12 ); ADD(  9 ); ADD( 13 );    NEXT; // A5 += -A12 + A9 + A13
    SUB( 13 ); ADD( 10 );               LAST; // A6 += -A13 + A10

cleanup:
    return( ret );
}